

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O2

bool bssl::ssl_credential_matches_requested_issuers(SSL_HANDSHAKE *hs,SSL_CREDENTIAL *cred)

{
  uchar *__first2;
  StackIterator<stack_st_CRYPTO_BUFFER> SVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Type *buf;
  uint8_t *puVar5;
  size_t sVar6;
  stack_st_CRYPTO_BUFFER *sk;
  int line;
  Span<const_unsigned_char> dn;
  StackIterator<stack_st_CRYPTO_BUFFER> SVar7;
  StackIterator<stack_st_CRYPTO_BUFFER> __begin2;
  CBS candidate;
  
  bVar2 = true;
  if (cred->must_match_issuer == true) {
    sk = (hs->ca_names)._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>.
         _M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
    if (sk != (stack_st_CRYPTO_BUFFER *)0x0) {
      __begin2.idx_ = 0;
      __begin2.sk_ = sk;
      SVar7 = end<stack_st_CRYPTO_BUFFER>(sk);
      sVar6 = 0;
      while (SVar1.idx_ = sVar6, SVar1.sk_ = sk, SVar7 != SVar1) {
        buf = internal::StackIteratorImpl<stack_st_CRYPTO_BUFFER>::operator*(&__begin2);
        puVar5 = CRYPTO_BUFFER_data(buf);
        sVar6 = CRYPTO_BUFFER_len(buf);
        dn.size_ = sVar6;
        dn.data_ = puVar5;
        bVar2 = ssl_credential_st::ChainContainsIssuer(cred,dn);
        if (bVar2) {
          return true;
        }
        sVar6 = __begin2.idx_ + 1;
        sk = __begin2.sk_;
        __begin2.idx_ = sVar6;
      }
    }
    bVar2 = true;
    if (((cred->trust_anchor_id).size_ == 0) ||
       ((hs->peer_requested_trust_anchors).
        super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
        super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
        super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_engaged != true)) {
LAB_0014f86c:
      line = 100;
      iVar4 = 0x143;
LAB_0014f883:
      bVar2 = false;
      ERR_put_error(0x10,0,iVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                    ,line);
    }
    else {
      __begin2.sk_ = (stack_st_CRYPTO_BUFFER *)
                     (hs->peer_requested_trust_anchors).
                     super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
                     super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
                     super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload._M_value.
                     data_;
      __begin2.idx_ =
           (hs->peer_requested_trust_anchors).
           super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
           super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
           super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload._M_value.size_;
      do {
        if (__begin2.idx_ == 0) goto LAB_0014f86c;
        iVar4 = CBS_get_u8_length_prefixed((CBS *)&__begin2,&candidate);
        if ((iVar4 == 0) || (candidate.len == 0)) {
          iVar4 = 0x44;
          line = 0x5a;
          goto LAB_0014f883;
        }
        __first2 = (cred->trust_anchor_id).data_;
        bVar3 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                          (candidate.data,candidate.data + candidate.len,__first2,
                           __first2 + (cred->trust_anchor_id).size_);
      } while (!bVar3);
      hs->field_0x6cb = hs->field_0x6cb | 4;
    }
  }
  return bVar2;
}

Assistant:

bool ssl_credential_matches_requested_issuers(SSL_HANDSHAKE *hs,
                                              const SSL_CREDENTIAL *cred) {
  if (!cred->must_match_issuer) {
    // This credential does not need to match a requested issuer, so
    // it is good to use without a match.
    return true;
  }

  // If we have names sent by the CA extension, and this
  // credential matches it, it is good.
  if (hs->ca_names != nullptr) {
    for (const CRYPTO_BUFFER *ca_name : hs->ca_names.get()) {
      if (cred->ChainContainsIssuer(
              Span(CRYPTO_BUFFER_data(ca_name), CRYPTO_BUFFER_len(ca_name)))) {
        return true;
      }
    }
  }
  // If the credential has a trust anchor ID and it matches one sent by the
  // peer, it is good.
  if (!cred->trust_anchor_id.empty() && hs->peer_requested_trust_anchors) {
    CBS cbs = CBS(*hs->peer_requested_trust_anchors), candidate;
    while (CBS_len(&cbs) > 0) {
      if (!CBS_get_u8_length_prefixed(&cbs, &candidate) ||
          CBS_len(&candidate) == 0) {
        OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
        return false;
      }
      if (candidate == Span(cred->trust_anchor_id)) {
        hs->matched_peer_trust_anchor = true;
        return true;
      }
    }
  }

  OPENSSL_PUT_ERROR(SSL, SSL_R_NO_MATCHING_ISSUER);
  return false;
}